

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  u8 uVar1;
  Btree *pBVar2;
  sqlite3 *db_00;
  TriggerPrg *p;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  size_t __n;
  ulong uVar8;
  Vdbe *pVVar9;
  long lVar10;
  int *piVar11;
  bool bVar12;
  char *zErrMsg;
  int cookie;
  char *local_200;
  uint local_1f8;
  u32 local_1f4;
  ulong local_1f0;
  char *local_1e8;
  u64 local_1e0;
  sqlite3_stmt **local_1d8;
  Vdbe *local_1d0;
  Parse local_1c8;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  local_1d8 = ppStmt;
  local_1d0 = pOld;
  iVar3 = sqlite3SafetyCheckOk(db);
  if ((zSql == (char *)0x0) || (iVar3 == 0)) {
    uVar4 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1e012,
                "fb90e7189ae6d62e77ba3a308ca5d683f90bbe633cf681865365b8e92792d1c7");
  }
  else {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    local_1f0 = (ulong)(uint)nBytes;
    local_1e0 = local_1f0 + 1;
    local_1e8 = zSql + local_1f0;
    uVar6 = CONCAT71((int7)((ulong)local_1e8 >> 8),1);
    do {
      local_1f8 = (uint)uVar6;
      do {
        local_200 = (char *)0x0;
        memset(&local_1c8,0,0xc4);
        memset(&local_1c8.sLastToken,0,0xa0);
        local_1c8.pReprepare = local_1d0;
        if ((prepFlags & 1) != 0) {
          local_1c8.disableLookaside = '\x01';
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
        iVar3 = db->nDb;
        if (0 < iVar3) {
          lVar10 = 0;
          lVar7 = 0;
          do {
            pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar10);
            if (pBVar2 != (Btree *)0x0) {
              if ((pBVar2->sharable != '\0') &&
                 (pBVar2->wantToLock = pBVar2->wantToLock + 1, pBVar2->locked == '\0')) {
                btreeLockCarefully(pBVar2);
              }
              uVar4 = querySharedCacheTableLock(pBVar2,1,'\x01');
              if (pBVar2->sharable != '\0') {
                piVar11 = &pBVar2->wantToLock;
                *piVar11 = *piVar11 + -1;
                if (*piVar11 == 0) {
                  unlockBtreeMutex(pBVar2);
                }
              }
              if (uVar4 != 0) {
                sqlite3ErrorWithMsg(db,uVar4,"database schema is locked: %s",
                                    *(undefined8 *)((long)&db->aDb->zDbSName + lVar10));
                goto LAB_00136fde;
              }
              iVar3 = db->nDb;
            }
            lVar7 = lVar7 + 1;
            lVar10 = lVar10 + 0x20;
          } while (lVar7 < iVar3);
        }
        sqlite3VtabUnlockList(db);
        local_1c8.db = db;
        if ((nBytes < 0) || ((nBytes != 0 && (zSql[local_1f0 - 1] == '\0')))) {
          sqlite3RunParser(&local_1c8,zSql,&local_200);
LAB_00136cf8:
          db_00 = local_1c8.db;
          if (local_1c8.rc == 0x65) {
            local_1c8.rc = 0;
          }
          if ((local_1c8.checkSchema != '\0') && (0 < (local_1c8.db)->nDb)) {
            lVar10 = 0;
            lVar7 = 0;
            do {
              pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar10);
              if (pBVar2 != (Btree *)0x0) {
                uVar1 = pBVar2->inTrans;
                if ((uVar1 == '\0') &&
                   (iVar3 = sqlite3BtreeBeginTrans(pBVar2,0,(int *)0x0), iVar3 != 0)) {
                  if (((iVar3 == 0xc0a) || (iVar3 == 7)) &&
                     ((db_00->mallocFailed == '\0' && (db_00->bBenignMalloc == '\0')))) {
                    db_00->mallocFailed = '\x01';
                    if (0 < db_00->nVdbeExec) {
                      (db_00->u1).isInterrupted = 1;
                    }
                    (db_00->lookaside).bDisable = (db_00->lookaside).bDisable + 1;
                  }
                  break;
                }
                sqlite3BtreeGetMeta(pBVar2,1,&local_1f4);
                if (local_1f4 != **(u32 **)((long)&db_00->aDb->pSchema + lVar10)) {
                  sqlite3ResetOneSchema(db_00,(int)lVar7);
                  local_1c8.rc = 0x11;
                }
                if (uVar1 == '\0') {
                  sqlite3BtreeCommit(pBVar2);
                }
              }
              lVar7 = lVar7 + 1;
              lVar10 = lVar10 + 0x20;
            } while (lVar7 < db_00->nDb);
          }
          if (db->mallocFailed != '\0') {
            local_1c8.rc = 7;
          }
          uVar4 = local_1c8.rc;
          if (pzTail != (char **)0x0) {
            *pzTail = local_1c8.zTail;
          }
          if ((local_1c8.explain != '\0' && local_1c8.pVdbe != (Vdbe *)0x0) && local_1c8.rc == 0) {
            bVar12 = local_1c8.explain == '\x02';
            uVar8 = (ulong)((uint)bVar12 * 8);
            sqlite3VdbeSetNumCols(local_1c8.pVdbe,(uint)!bVar12 * 4 + 4);
            piVar11 = (int *)(sqlite3Prepare_azColName_rel + (ulong)bVar12 * 0x20);
            lVar7 = 0;
            do {
              if ((local_1c8.pVdbe)->db->mallocFailed == '\0') {
                sqlite3VdbeMemSetStr
                          ((Mem *)((long)&(local_1c8.pVdbe)->aColName->u + lVar7),
                           sqlite3Prepare_azColName_rel + *piVar11,-1,'\x01',
                           (_func_void_void_ptr *)0x0);
              }
              uVar8 = uVar8 + 1;
              piVar11 = piVar11 + 1;
              lVar7 = lVar7 + 0x38;
            } while (uVar8 < (ulong)bVar12 * 4 + 8);
          }
          pVVar9 = local_1c8.pVdbe;
          if ((db->init).busy == '\0') {
            if (local_1c8.pVdbe != (Vdbe *)0x0) {
              (local_1c8.pVdbe)->prepFlags = (u8)prepFlags;
              if (-1 < (char)(u8)prepFlags) {
                (local_1c8.pVdbe)->expmask = 0;
              }
              __n = (size_t)((int)local_1c8.zTail - (int)zSql);
              pcVar5 = (char *)sqlite3DbMallocRawNN((local_1c8.pVdbe)->db,__n + 1);
              if (pcVar5 != (char *)0x0) {
                memcpy(pcVar5,zSql,__n);
                pcVar5[__n] = '\0';
              }
              pVVar9->zSql = pcVar5;
              goto LAB_00136f40;
            }
LAB_00136f5a:
            pVVar9 = (Vdbe *)0x0;
LAB_00136f5d:
            *local_1d8 = (sqlite3_stmt *)pVVar9;
          }
          else {
LAB_00136f40:
            if (local_1c8.pVdbe == (Vdbe *)0x0) goto LAB_00136f5a;
            if ((uVar4 == 0) && (pVVar9 = local_1c8.pVdbe, db->mallocFailed == '\0'))
            goto LAB_00136f5d;
            sqlite3VdbeFinalize(local_1c8.pVdbe);
          }
          pcVar5 = local_200;
          if (local_200 == (char *)0x0) {
            db->errCode = uVar4;
            if ((uVar4 != 0) || (db->pErr != (sqlite3_value *)0x0)) {
              sqlite3ErrorFinish(db,uVar4);
            }
          }
          else {
            sqlite3ErrorWithMsg(db,uVar4,"%s",local_200);
            sqlite3DbFreeNN(db,pcVar5);
          }
          while (p = local_1c8.pTriggerPrg, local_1c8.pTriggerPrg != (TriggerPrg *)0x0) {
            local_1c8.pTriggerPrg = (local_1c8.pTriggerPrg)->pNext;
            sqlite3DbFreeNN(db,p);
          }
        }
        else {
          if (nBytes <= db->aLimit[1]) {
            pcVar5 = (char *)sqlite3DbMallocRawNN(db,local_1e0);
            uVar8 = local_1f0;
            if (pcVar5 == (char *)0x0) {
              local_1c8.zTail = local_1e8;
            }
            else {
              memcpy(pcVar5,zSql,local_1f0);
              pcVar5[uVar8] = '\0';
              sqlite3RunParser(&local_1c8,pcVar5,&local_200);
              local_1c8.zTail = zSql + ((long)local_1c8.zTail - (long)pcVar5);
              sqlite3DbFreeNN(db,pcVar5);
            }
            goto LAB_00136cf8;
          }
          sqlite3ErrorWithMsg(db,0x12,"statement too long");
          if (db->mallocFailed != '\0') {
            apiOomError(db);
            sqlite3ParserReset(&local_1c8);
            uVar4 = 7;
            goto LAB_0013707e;
          }
          uVar4 = db->errMask & 0x12;
        }
LAB_00136fde:
        sqlite3ParserReset(&local_1c8);
      } while (uVar4 == 0x201);
      if (uVar4 != 0x11) {
LAB_0013707e:
        if (db->noSharedCache == '\0') {
          btreeLeaveAll(db);
        }
        if ((uVar4 == 0xc0a) || (db->mallocFailed != '\0')) goto LAB_001370a1;
        uVar4 = uVar4 & db->errMask;
        goto LAB_001370af;
      }
      sqlite3ResetOneSchema(db,-1);
      uVar6 = 0;
    } while ((local_1f8 & 1) != 0);
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    if (db->mallocFailed == '\0') {
      uVar4 = db->errMask & 0x11;
    }
    else {
LAB_001370a1:
      apiOomError(db);
      uVar4 = 7;
    }
LAB_001370af:
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar4;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
  }while( rc==SQLITE_ERROR_RETRY
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}